

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::createNodeTree(OpenGEXImporter *this,aiScene *pScene)

{
  _List_node_base *p_Var1;
  aiNode *paVar2;
  aiNode **ppaVar3;
  
  p_Var1 = (_List_node_base *)this->m_root;
  if ((p_Var1 != (_List_node_base *)0x0) &&
     ((((list<aiNode_*,_std::allocator<aiNode_*>_> *)&p_Var1->_M_next)->
      super__List_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl._M_node.super__List_node_base.
      _M_next != p_Var1)) {
    pScene->mRootNode->mNumChildren = *(uint *)(p_Var1 + 1);
    paVar2 = pScene->mRootNode;
    ppaVar3 = (aiNode **)operator_new__((ulong)paVar2->mNumChildren << 3);
    paVar2->mChildren = ppaVar3;
    std::__copy_move<false,false,std::bidirectional_iterator_tag>::
    __copy_m<std::_List_iterator<aiNode*>,aiNode**>
              (((_List_node_base *)this->m_root)->_M_next,(_List_node_base *)this->m_root,
               pScene->mRootNode->mChildren);
    return;
  }
  return;
}

Assistant:

void OpenGEXImporter::createNodeTree( aiScene *pScene ) {
    if( nullptr == m_root ) {
        return;
    }

    if( m_root->m_children.empty() ) {
        return;
    }

    pScene->mRootNode->mNumChildren = static_cast<unsigned int>(m_root->m_children.size());
    pScene->mRootNode->mChildren = new aiNode*[ pScene->mRootNode->mNumChildren ];
    std::copy( m_root->m_children.begin(), m_root->m_children.end(), pScene->mRootNode->mChildren );
}